

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderCursor(CHud *this)

{
  long lVar1;
  vec2 vVar2;
  int iVar3;
  IClient *this_00;
  vec2 *pvVar4;
  CLayers *this_01;
  CMapItemGroup *pCVar5;
  IGraphics *pIVar6;
  CDataSprite *in_RDI;
  long in_FS_OFFSET;
  float CursorSize;
  vec2 Pos;
  float Size;
  float in_stack_ffffffffffffffc0;
  CMapItemGroup *in_stack_ffffffffffffffc8;
  CDataWeaponspec *this_02;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_pSet[0xdc].m_pImage != (CDataImage *)0x0) {
    this_00 = CComponent::Client((CComponent *)0x167b7d);
    iVar3 = IClient::State(this_00);
    if (iVar3 != 4) {
      pvVar4 = CCamera::GetCenter((CCamera *)in_RDI->m_pSet[0x1b1f].m_pImage);
      vVar2 = *pvVar4;
      CComponent::RenderTools((CComponent *)0x167bb6);
      local_10 = vVar2.field_0;
      this_01 = CComponent::Layers((CComponent *)0x167bdc);
      pCVar5 = CLayers::GameGroup(this_01);
      Size = (float)((ulong)pCVar5 >> 0x20);
      CCamera::GetZoom((CCamera *)in_RDI->m_pSet[0x1b1f].m_pImage);
      CRenderTools::MapScreenToGroup
                ((CRenderTools *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),in_stack_ffffffffffffffc8,local_10.x
                );
      pIVar6 = CComponent::Graphics((CComponent *)0x167c28);
      (*(pIVar6->super_IInterface)._vptr_IInterface[0x13])
                (pIVar6,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
      pIVar6 = CComponent::Graphics((CComponent *)0x167c57);
      (*(pIVar6->super_IInterface)._vptr_IInterface[0x17])();
      CComponent::RenderTools((CComponent *)0x167c6d);
      this_02 = (g_pData->m_Weapons).m_aId;
      CRenderTools::SelectSprite
                ((CRenderTools *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 in_RDI,(int)((ulong)this_02 >> 0x20),(int)this_02,(int)local_10);
      CComponent::RenderTools((CComponent *)0x167cda);
      CRenderTools::DrawSprite((CRenderTools *)this_02,local_10.x,in_stack_ffffffffffffffc0,Size);
      pIVar6 = CComponent::Graphics((CComponent *)0x167d17);
      (*(pIVar6->super_IInterface)._vptr_IInterface[0x18])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderCursor()
{
	if(!m_pClient->m_Snap.m_pLocalCharacter || Client()->State() == IClient::STATE_DEMOPLAYBACK)
		return;

	vec2 Pos = *m_pClient->m_pCamera->GetCenter();
	RenderTools()->MapScreenToGroup(Pos.x, Pos.y, Layers()->GameGroup(), m_pClient->m_pCamera->GetZoom());
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();

	// render cursor
	RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[m_pClient->m_Snap.m_pLocalCharacter->m_Weapon%NUM_WEAPONS].m_pSpriteCursor);
	float CursorSize = 64;
	RenderTools()->DrawSprite(m_pClient->m_pControls->m_TargetPos.x, m_pClient->m_pControls->m_TargetPos.y, CursorSize);
	Graphics()->QuadsEnd();
}